

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
tf::SmallVectorImpl<tf::Node_*>::swap
          (SmallVectorImpl<tf::Node_*> *this,SmallVectorImpl<tf::Node_*> *RHS)

{
  undefined8 uVar1;
  size_type i;
  undefined1 *puVar2;
  void *__dest;
  void *__tmp;
  undefined1 *puVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  void *pvVar7;
  size_t EltDiff_1;
  ulong uVar8;
  size_t EltDiff;
  ulong uVar9;
  
  if (this != RHS) {
    puVar3 = (undefined1 *)
             (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    puVar2 = (undefined1 *)
             (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
             super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
    if ((U *)puVar2 ==
        &(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
         super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl ||
        (U *)puVar3 ==
        &(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
         super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
      uVar6 = (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
              (long)puVar2;
      if ((ulong)((long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)puVar3) < uVar6) {
        SmallVectorTemplateBase<tf::Node_*,_true>::grow
                  (&this->super_SmallVectorTemplateBase<tf::Node_*,_true>,(long)uVar6 >> 3);
        puVar3 = (undefined1 *)
                 (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        puVar2 = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      }
      uVar6 = (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
              (long)puVar3;
      if ((ulong)((long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                        CapacityX - (long)puVar2) < uVar6) {
        SmallVectorTemplateBase<tf::Node_*,_true>::grow
                  (&RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>,(long)uVar6 >> 3);
        puVar2 = (undefined1 *)
                 (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        uVar6 = (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
                (long)(this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX
        ;
      }
      uVar9 = (long)(RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
              (long)puVar2 >> 3;
      if ((ulong)((long)uVar6 >> 3) < uVar9) {
        uVar9 = (long)uVar6 >> 3;
      }
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        pvVar5 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                 super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        uVar1 = *(undefined8 *)((long)pvVar4 + uVar6 * 8);
        *(undefined8 *)((long)pvVar4 + uVar6 * 8) = *(undefined8 *)((long)pvVar5 + uVar6 * 8);
        *(undefined8 *)((long)pvVar5 + uVar6 * 8) = uVar1;
      }
      pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      pvVar5 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      uVar6 = (long)pvVar5 - (long)pvVar4 >> 3;
      pvVar7 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
      __dest = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      uVar8 = (long)__dest - (long)pvVar7 >> 3;
      if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
        if (uVar6 <= uVar8 && uVar8 - uVar6 != 0) {
          pvVar4 = (void *)((long)pvVar7 + uVar9 * 8);
          if (pvVar4 != __dest) {
            memcpy(pvVar5,pvVar4,(long)__dest - (long)pvVar4);
            pvVar5 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
            pvVar7 = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                     super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
          }
          (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               (void *)((long)pvVar5 + (uVar8 - uVar6) * 8);
          (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
          super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
               (void *)((long)pvVar7 + uVar9 * 8);
        }
      }
      else {
        pvVar7 = (void *)((long)pvVar4 + uVar9 * 8);
        if (pvVar7 != pvVar5) {
          memcpy(__dest,pvVar7,(long)pvVar5 - (long)pvVar7);
          __dest = (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
          pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
                   super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
        }
        (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
             (void *)((long)__dest + (uVar6 - uVar8) * 8);
        (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
             (void *)((long)pvVar4 + uVar9 * 8);
      }
    }
    else {
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = puVar2;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = puVar3;
      pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
           (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pvVar4;
      pvVar4 = (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
      (this->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
           (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
      (RHS->super_SmallVectorTemplateBase<tf::Node_*,_true>).
      super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX = pvVar4;
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->EndX, RHS.EndX);
    std::swap(this->CapacityX, RHS.CapacityX);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.setEnd(RHS.end()+EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->setEnd(this->begin()+NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->setEnd(this->end() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.setEnd(RHS.begin()+NumShared);
  }
}